

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# futex_waiter.cc
# Opt level: O0

int absl::lts_20240722::synchronization_internal::FutexWaiter::WaitUntil
              (atomic<int> *v,int32_t val,KernelTimeout t)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 local_48 [8];
  timespec abs_timespec;
  timespec rel_timespec;
  bool kHasClockMonotonic;
  int32_t val_local;
  atomic<int> *v_local;
  KernelTimeout t_local;
  
  v_local = (atomic<int> *)t.rep_;
  bVar1 = KernelTimeout::has_timeout((KernelTimeout *)&v_local);
  if (bVar1) {
    bVar1 = KernelTimeout::is_relative_timeout((KernelTimeout *)&v_local);
    if (bVar1) {
      abs_timespec.tv_nsec =
           absl::lts_20240722::synchronization_internal::KernelTimeout::MakeRelativeTimespec();
      t_local.rep_._4_4_ = FutexImpl::WaitRelativeTimeout(v,val,(timespec *)&abs_timespec.tv_nsec);
    }
    else {
      auVar2 = absl::lts_20240722::synchronization_internal::KernelTimeout::MakeAbsTimespec();
      abs_timespec.tv_sec = auVar2._8_8_;
      local_48 = auVar2._0_8_;
      t_local.rep_._4_4_ = FutexImpl::WaitAbsoluteTimeout(v,val,(timespec *)local_48);
    }
  }
  else {
    t_local.rep_._4_4_ = FutexImpl::Wait(v,val);
  }
  return t_local.rep_._4_4_;
}

Assistant:

int FutexWaiter::WaitUntil(std::atomic<int32_t>* v, int32_t val,
                           KernelTimeout t) {
#ifdef CLOCK_MONOTONIC
  constexpr bool kHasClockMonotonic = true;
#else
  constexpr bool kHasClockMonotonic = false;
#endif

  // We can't call Futex::WaitUntil() here because the prodkernel implementation
  // does not know about KernelTimeout::SupportsSteadyClock().
  if (!t.has_timeout()) {
    return Futex::Wait(v, val);
  } else if (kHasClockMonotonic && KernelTimeout::SupportsSteadyClock() &&
             t.is_relative_timeout()) {
    auto rel_timespec = t.MakeRelativeTimespec();
    return Futex::WaitRelativeTimeout(v, val, &rel_timespec);
  } else {
    auto abs_timespec = t.MakeAbsTimespec();
    return Futex::WaitAbsoluteTimeout(v, val, &abs_timespec);
  }
}